

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O3

obj * realloc_obj(obj *obj,int oextra_size,void *oextra_src,int oname_size,char *name)

{
  boolean bVar1;
  obj *inside;
  obj *obj_00;
  obj *poVar2;
  long lVar3;
  obj *poVar4;
  byte bVar5;
  
  bVar5 = 0;
  obj_00 = (obj *)malloc((ulong)(uint)(oextra_size + oname_size) + 0x68);
  poVar2 = obj;
  poVar4 = obj_00;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    poVar4->nobj = poVar2->nobj;
    poVar2 = (obj *)((long)poVar2 + (ulong)bVar5 * -0x10 + 8);
    poVar4 = (obj *)((long)poVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  if (oextra_size == 0) {
    obj_00->field_0x4c = obj_00->field_0x4c & 0x9f;
  }
  else if (oextra_src != (void *)0x0) {
    memcpy(obj_00->oextra,oextra_src,(long)oextra_size);
  }
  obj_00->oxlth = (short)oextra_size;
  obj_00->onamelth = (uchar)oname_size;
  if (name != (char *)0x0 && oname_size != 0) {
    strcpy((char *)((long)obj_00->oextra + (long)(short)oextra_size),name);
  }
  bVar1 = u.twoweap;
  if (obj->olev == (level *)0x0) {
    obj->where = '\0';
    obj->timed = '\0';
    obj->field_0x4c = obj->field_0x4c & 0xf7;
  }
  else {
    if ((long)obj->owornmask != 0) {
      setworn((obj *)0x0,(long)obj->owornmask);
      setworn(obj_00,(long)obj_00->owornmask);
    }
    u.twoweap = bVar1;
    replace_object(obj,obj_00);
    for (poVar2 = obj->cobj; poVar2 != (obj *)0x0; poVar2 = poVar2->nobj) {
      (poVar2->v).v_nexthere = obj_00;
    }
    obj_00->timed = '\0';
    if (obj->timed != '\0') {
      obj_move_timers(obj,obj_00);
    }
    obj_00->field_0x4c = obj_00->field_0x4c & 0xf7;
    if ((obj->field_0x4c & 8) != 0) {
      obj_move_light_source(obj,obj_00);
    }
    if (obj->oclass == '\n') {
      book_substitution(obj,obj_00);
    }
    else if (obj->oclass == '\a') {
      food_substitution(obj,obj_00);
    }
  }
  dealloc_obj(obj);
  return obj_00;
}

Assistant:

struct obj *realloc_obj(struct obj *obj, int oextra_size, void *oextra_src,
			int oname_size, const char *name)
{
	struct obj *otmp;

	otmp = newobj(oextra_size + oname_size);
	*otmp = *obj;	/* the cobj pointer is copied to otmp */
	if (oextra_size) {
	    if (oextra_src)
		memcpy(otmp->oextra, oextra_src, oextra_size);
	} else {
	    otmp->oattached = OATTACHED_NOTHING;
	}
	otmp->oxlth = oextra_size;
	otmp->onamelth = oname_size;
	
	if (oname_size) {
	    if (name)
		strcpy(ONAME(otmp), name);
	}

	/* !obj->olev means the obj is currently being restored and no pointer
	 * from or to it is valid. Re-equipping, timer linking, etc. will happen
	 * elsewhere in that case. */
	if (obj->olev) { 
	    if (obj->owornmask) {
		    boolean save_twoweap = u.twoweap;
		    /* unwearing the old instance will clear dual-wield mode
		    if this object is either of the two weapons */
		    setworn(NULL, obj->owornmask);
		    setworn(otmp, otmp->owornmask);
		    u.twoweap = save_twoweap;
	    }

	    /* replace obj with otmp */
	    replace_object(obj, otmp);

	    /* fix ocontainer pointers */
	    if (Has_contents(obj)) {
		    struct obj *inside;

		    for (inside = obj->cobj; inside; inside = inside->nobj)
			    inside->ocontainer = otmp;
	    }

	    /* move timers and light sources from obj to otmp */
	    otmp->timed = 0;	/* not timed, yet */
	    if (obj->timed) obj_move_timers(obj, otmp);
	    otmp->lamplit = 0;	/* ditto */
	    if (obj->lamplit) obj_move_light_source(obj, otmp);

	    /* objects possibly being manipulated by multi-turn occupations
	    which have been interrupted but might be subsequently resumed */
	    if (obj->oclass == FOOD_CLASS)
		food_substitution(obj, otmp);	/* eat food or open tin */
	    else if (obj->oclass == SPBOOK_CLASS)
		book_substitution(obj, otmp);	/* read spellbook */
	} else {
	    /* make sure dealloc_obj doesn't explode */
	    obj->where = OBJ_FREE;
	    obj->timed = FALSE;
	    obj->lamplit = FALSE;
	}
	/* obfree(obj, otmp);	now unnecessary: no pointers on bill */
	dealloc_obj(obj);	/* let us hope nobody else saved a pointer */
	return otmp;
}